

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O2

void __thiscall
Inferences::AdditionGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
          *poly)

{
  Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
  *this_00;
  MaybeUninit<Kernel::Variable> var_00;
  undefined4 key;
  bool bVar1;
  Option<Kernel::Variable> var;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_160;
  MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> gen;
  StlIter __begin0;
  StlIter __begin0_1;
  Set<Kernel::Variable,_Lib::StlHash> didOccur;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> factor;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> monom;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_98;
  AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> local_74;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_50;
  
  Lib::Set<Kernel::Variable,_Lib::StlHash>::Set(&didOccur);
  local_50._iter._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)poly->_ptr;
  local_50._iter._inner._to =
       ((long)(local_50._iter._func.a)->_cursor - (long)(local_50._iter._func.a)->_stack) / 0x30;
  local_50._iter._inner._next = 0;
  local_50._iter._inner._from = 0;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
  ::StlIter::StlIter(&__begin0,&local_50);
  do {
    if ((OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>)
        __begin0._cur.
        super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
        super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
        ._elem == (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                   )0x0) {
      Lib::Set<Kernel::Variable,_Lib::StlHash>::~Set(&didOccur);
      return;
    }
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (&monom,(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      __begin0._cur.
                      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>
                      .
                      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                      ._elem);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryVar
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&var);
    if (var.super_OptionBase<Kernel::Variable>._isSome == true) {
      bVar1 = Lib::Set<Kernel::Variable,_Lib::StlHash>::contains
                        (&didOccur,(Variable)var.super_OptionBase<Kernel::Variable>._elem._elem);
      var_00 = var.super_OptionBase<Kernel::Variable>._elem;
      if (bVar1) goto LAB_003c58d8;
      Lib::Set<Kernel::Variable,_Lib::StlHash>::insert
                (&didOccur,(Variable)var.super_OptionBase<Kernel::Variable>._elem._elem);
      local_160._id = poly->_id;
      local_160._ptr = poly->_ptr;
      MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomSet
                (&gen,(Variable)var_00._elem,&local_160);
      Lib::
      Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
      ::operator()((Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
                    *)this->map,(Variable)var_00._elem,&gen,&gen);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                (&gen._cancellable);
    }
    else {
LAB_003c58d8:
      gen._cancellable._end =
           (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
           (((long)((monom.factors._ptr)->_factors)._cursor -
            (long)((monom.factors._ptr)->_factors)._stack) / 0x1c);
      gen._cancellable._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
      gen._cancellable._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
      gen._cancellable._capacity = (size_t)monom.factors._ptr;
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
      ::StlIter::StlIter(&__begin0_1,
                         (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
                          *)&gen);
      while ((OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
              )__begin0_1._cur.
               super_OptionBase<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>
               .
               super_OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
               ._elem !=
             (OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
              )0x0) {
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomFactor
                  (&factor,(MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                           __begin0_1._cur.
                           super_OptionBase<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>
                           .
                           super_OptionBaseRef<const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*>
                           ._elem);
        key = factor.term.super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content._0_4_;
        if ((factor.term.super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._0_1_ & 3) == 1) {
          this_00 = this->map;
          MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::bot();
          AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::AnyNumber
                    (&local_74,
                     (MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_98);
          Lib::
          Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
          ::replaceOrInsert(this_00,(Variable)key,&local_74);
          Lib::CoproductImpl::TrivialOperations::Destr::
          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          *)&local_74);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                    (&local_98);
        }
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
        ::StlIter::operator++(&__begin0_1);
      }
    }
    Kernel::RationalConstantType::~RationalConstantType(&monom.numeral);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
    ::StlIter::operator++(&__begin0);
  } while( true );
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> poly)
  {
    // a variable might occur twice within one sum.
    Set<Variable, StlHash> didOccur;
    for (auto monom : poly->iterSummands()) {
      auto var = monom.tryVar();

      if (var.isSome() && !didOccur.contains(var.unwrap())) {
        auto v = var.unwrap();
        didOccur.insert(v);
        auto gen = MonomSet<NumTraits>(v, poly);
        map.updateOrInit(v,
            [&](AnyNumber<MonomSet> old_) 
            { 
              auto old = old_.downcast<NumTraits>().unwrap();
              auto result = std::move(old).intersect(std::move(gen));
              return AnyNumber<MonomSet>(std::move(result));
            },
            [&]() { return AnyNumber<MonomSet>(std::move(gen)); });
      } else {
        for (auto factor : monom.factors->iter()) {
           if (factor.term.template is<Variable>()) {
             auto v = factor.term.template unwrap<Variable>();
             map.replaceOrInsert(v, MonomSet<NumTraits>::bot());
           }
        }
      }

    }
  }